

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

XmlWriter * __thiscall
Catch::XmlWriter::writeAttribute<Catch::StringRef>
          (XmlWriter *this,string *name,StringRef *attribute)

{
  long in_FS_OFFSET;
  ReusableStringStream rss;
  ReusableStringStream local_60;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  ReusableStringStream::ReusableStringStream(&local_60);
  Catch::operator<<(local_60.m_oss,attribute);
  std::__cxx11::stringbuf::str();
  writeAttribute(this,name,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  ReusableStringStream::~ReusableStringStream(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

XmlWriter& writeAttribute( std::string const& name, T const& attribute ) {
            ReusableStringStream rss;
            rss << attribute;
            return writeAttribute( name, rss.str() );
        }